

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSimpleProperty::~IfcSimpleProperty(IfcSimpleProperty *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  long *plVar3;
  long *plVar4;
  
  *(undefined8 *)&this[-1].super_IfcProperty.field_0x28 = 0x810fe8;
  *(undefined8 *)
   &(this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
    field_0x10 = 0x811010;
  puVar2 = *(undefined1 **)&this[-1].super_IfcProperty.field_0x58;
  puVar1 = &this[-1].super_IfcProperty.field_0x68;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  plVar3 = (long *)this[-1].super_IfcProperty.Description.ptr._M_string_length;
  plVar4 = (long *)((long)&this[-1].super_IfcProperty.Description.ptr.field_2 + 8);
  if (plVar3 != plVar4) {
    operator_delete(plVar3,*plVar4 + 1);
  }
  operator_delete(&this[-1].super_IfcProperty.field_0x28,0x80);
  return;
}

Assistant:

IfcSimpleProperty() : Object("IfcSimpleProperty") {}